

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O2

void __thiscall TileWire::flip(TileWire *this,bool acrossHorizontal,bool noAdjacentUpdates)

{
  Direction DVar1;
  Board *pBVar2;
  
  if (this->_type == TEE) {
    DVar1 = (this->super_Tile)._direction;
    if (acrossHorizontal) {
      if ((DVar1 & 0x80000001) != EAST) {
        return;
      }
    }
    else if ((DVar1 & EAST) != NORTH) {
      return;
    }
    DVar1 = (int)(DVar1 + SOUTH) % 4;
  }
  else {
    if (this->_type != CORNER) {
      return;
    }
    DVar1 = (this->super_Tile)._direction;
    if (acrossHorizontal) {
      if ((DVar1 & EAST) == NORTH) {
        DVar1 = DVar1 | EAST;
      }
      else {
        DVar1 = DVar1 - EAST;
      }
    }
    else {
      DVar1 = WEST - DVar1;
    }
  }
  (this->super_Tile)._direction = DVar1;
  (*(this->super_Tile)._vptr_Tile[8])(this,0,noAdjacentUpdates);
  pBVar2 = Tile::getBoardPtr(&this->super_Tile);
  pBVar2->changesMade = true;
  return;
}

Assistant:

void TileWire::flip(bool acrossHorizontal, bool noAdjacentUpdates) {
    if (_type == CORNER) {
        if (!acrossHorizontal) {
            _direction = static_cast<Direction>(3 - _direction);
        } else if (_direction % 2 == 0) {
            _direction = static_cast<Direction>(_direction + 1);
        } else {
            _direction = static_cast<Direction>(_direction - 1);
        }
        addUpdate(false, noAdjacentUpdates);
        getBoardPtr()->changesMade = true;
    } else if (_type == TEE && ((!acrossHorizontal && _direction % 2 == 0) || (acrossHorizontal && _direction % 2 == 1))) {
        _direction = static_cast<Direction>((_direction + 2) % 4);
        addUpdate(false, noAdjacentUpdates);
        getBoardPtr()->changesMade = true;
    }
}